

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O2

void av1_inv_txfm_add_c(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  int r;
  ulong uVar1;
  undefined1 *puVar2;
  uint8_t *puVar3;
  int c;
  ulong uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint16_t tmp [4096];
  undefined1 local_2060 [8240];
  
  puVar5 = local_2060;
  uVar1 = 0;
  uVar6 = (ulong)(uint)tx_size_wide[txfm_param->tx_size];
  if (tx_size_wide[txfm_param->tx_size] < 1) {
    uVar6 = uVar1;
  }
  puVar2 = local_2060;
  puVar3 = dst;
  uVar7 = (ulong)(uint)tx_size_high[txfm_param->tx_size];
  if (tx_size_high[txfm_param->tx_size] < 1) {
    puVar2 = local_2060;
    uVar7 = uVar1;
  }
  for (; uVar1 != uVar7; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      *(ushort *)(puVar2 + uVar4 * 2) = (ushort)puVar3[uVar4];
    }
    puVar2 = puVar2 + 0x80;
    puVar3 = puVar3 + stride;
  }
  (*av1_highbd_inv_txfm_add)(dqcoeff,(uint8_t *)((ulong)local_2060 >> 1),0x40,txfm_param);
  for (uVar1 = 0; uVar1 != uVar7; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      dst[uVar4] = puVar5[uVar4 * 2];
    }
    dst = dst + stride;
    puVar5 = puVar5 + 0x80;
  }
  return;
}

Assistant:

void av1_inv_txfm_add_c(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                        const TxfmParam *txfm_param) {
  const TX_SIZE tx_size = txfm_param->tx_size;
  DECLARE_ALIGNED(32, uint16_t, tmp[MAX_TX_SQUARE]);
  int tmp_stride = MAX_TX_SIZE;
  int w = tx_size_wide[tx_size];
  int h = tx_size_high[tx_size];
  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      tmp[r * tmp_stride + c] = dst[r * stride + c];
    }
  }

  av1_highbd_inv_txfm_add(dqcoeff, CONVERT_TO_BYTEPTR(tmp), tmp_stride,
                          txfm_param);

  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      dst[r * stride + c] = (uint8_t)tmp[r * tmp_stride + c];
    }
  }
}